

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O0

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
WriteCallArg(ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
             *this,Expr arg)

{
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  SafeBool SVar1;
  char *pcVar2;
  size_t in_RSI;
  long in_RDI;
  char c;
  char *s;
  NumericExpr e;
  ExprBase in_stack_ffffffffffffff78;
  char value_01;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  BasicWriter<char> *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  char in_stack_ffffffffffffffaf;
  size_t in_stack_ffffffffffffffb0;
  size_t sVar3;
  undefined8 in_stack_ffffffffffffffc0;
  int precedence;
  ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
  *in_stack_ffffffffffffffc8;
  ExprBase in_stack_ffffffffffffffd0;
  ExprBase local_18 [2];
  size_t local_8;
  
  precedence = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  local_8 = in_RSI;
  local_18[0].impl_ =
       (Impl *)internal::ExprTypes::Cast<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                         ((Expr)in_stack_ffffffffffffff78.impl_);
  SVar1 = internal::ExprBase::operator_cast_to_function_pointer(local_18);
  if (SVar1 == 0) {
    fmt::BasicStringRef<char>::BasicStringRef
              ((BasicStringRef<char> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
               ,(char *)in_stack_ffffffffffffff78.impl_);
    value.data_._7_1_ = in_stack_ffffffffffffffaf;
    value.data_._0_7_ = in_stack_ffffffffffffffa8;
    value.size_ = in_stack_ffffffffffffffb0;
    fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffa0,value);
    internal::ExprTypes::Cast<mp::StringLiteral>((Expr)in_stack_ffffffffffffff78.impl_);
    pcVar2 = StringLiteral::value((StringLiteral *)0x1c4b83);
    sVar3 = local_8;
    for (; *pcVar2 != '\0'; pcVar2 = pcVar2 + 1) {
      in_stack_ffffffffffffffaf = *pcVar2;
      in_stack_ffffffffffffff84 = (int)in_stack_ffffffffffffffaf;
      value_01 = (char)((ulong)in_stack_ffffffffffffff78.impl_ >> 0x38);
      if (in_stack_ffffffffffffff84 == 10) {
        fmt::BasicWriter<char>::operator<<
                  ((BasicWriter<char> *)CONCAT44(10,in_stack_ffffffffffffff80),value_01);
        fmt::BasicWriter<char>::operator<<
                  ((BasicWriter<char> *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (char)((ulong)in_stack_ffffffffffffff78.impl_ >> 0x38));
      }
      else {
        if (in_stack_ffffffffffffff84 == 0x27) {
          fmt::BasicWriter<char>::operator<<
                    ((BasicWriter<char> *)CONCAT44(0x27,in_stack_ffffffffffffff80),value_01);
        }
        fmt::BasicWriter<char>::operator<<
                  ((BasicWriter<char> *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (char)((ulong)in_stack_ffffffffffffff78.impl_ >> 0x38));
      }
    }
    fmt::BasicStringRef<char>::BasicStringRef
              ((BasicStringRef<char> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
               ,*(char **)(in_RDI + 8));
    value_00.data_._7_1_ = in_stack_ffffffffffffffaf;
    value_00.data_._0_7_ = in_stack_ffffffffffffffa8;
    value_00.size_ = sVar3;
    fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffa0,value_00);
  }
  else {
    Visit(in_stack_ffffffffffffffc8,(NumericExpr)in_stack_ffffffffffffffd0.impl_,precedence);
  }
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::WriteCallArg(Expr arg) {
  if (NumericExpr e = ExprTypes::template Cast<NumericExpr>(arg)) {
    Visit(e, prec::UNKNOWN);
    return;
  }
  assert(arg.kind() == expr::STRING);
  writer_ << "'";
  const char *s = ExprTypes::template Cast<StringLiteral>(arg).value();
  for ( ; *s; ++s) {
    char c = *s;
    switch (c) {
    case '\n':
      writer_ << '\\' << c;
      break;
    case '\'':
      // Escape quote by doubling.
      writer_ << c;
      // Fall through.
    default:
      writer_ << c;
    }
  }
  writer_ << "'";
}